

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O0

void __thiscall VoltageDependance::setParameter(VoltageDependance *this,string *name,string *value)

{
  bool bVar1;
  stringstream local_1a8 [8];
  stringstream param;
  ostream local_198;
  string *local_20;
  string *value_local;
  string *name_local;
  VoltageDependance *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,(string *)local_20);
  bVar1 = std::operator==(value_local,"reversal-potential");
  if (bVar1) {
    std::istream::operator>>((istream *)local_1a8,&this->dReversal);
  }
  else {
    bVar1 = std::operator==(value_local,"weight");
    if (bVar1) {
      std::istream::operator>>((istream *)local_1a8,&this->dWeight);
    }
    else {
      Parametric::setParameter((Parametric *)this,value_local,local_20);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void VoltageDependance::setParameter(const string& name, const string& value)
{
	stringstream param;
	param << value;
	
	if (name=="reversal-potential") 
		param >> dReversal;
	else if (name=="weight")
		param >> dWeight;
	else
		StochasticFunction::setParameter(name, value);
}